

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O2

Vec_Int_t * Fra_ClauSaveLatchVars(Aig_Man_t *pMan,Cnf_Dat_t *pCnf,int fCsVars)

{
  Vec_Int_t *p;
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  
  p = Vec_IntAlloc(pMan->nRegs);
  for (iVar3 = 0; iVar3 < pMan->nRegs; iVar3 = iVar3 + 1) {
    pvVar1 = Vec_PtrEntry(pMan->vCos,(pMan->nObjs[3] - pMan->nRegs) + iVar3);
    pvVar2 = Vec_PtrEntry(pMan->vCis,(pMan->nObjs[2] - pMan->nRegs) + iVar3);
    if (fCsVars == 0) {
      pvVar2 = pvVar1;
    }
    Vec_IntPush(p,pCnf->pVarNums[*(int *)((long)pvVar2 + 0x24)]);
  }
  return p;
}

Assistant:

Vec_Int_t * Fra_ClauSaveLatchVars( Aig_Man_t * pMan, Cnf_Dat_t * pCnf, int fCsVars )
{
    Vec_Int_t * vVars;
    Aig_Obj_t * pObjLo, * pObjLi;
    int i;
    vVars = Vec_IntAlloc( Aig_ManRegNum(pMan) );
    Aig_ManForEachLiLoSeq( pMan, pObjLi, pObjLo, i )
        Vec_IntPush( vVars, pCnf->pVarNums[fCsVars? pObjLo->Id : pObjLi->Id] );
    return vVars;
}